

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

bool __thiscall llvm::detail::DoubleAPFloat::isLargest(DoubleAPFloat *this)

{
  APFloat *pAVar1;
  APFloat *pAVar2;
  cmpResult cVar3;
  bool bVar4;
  undefined1 auStack_28 [8];
  _Head_base<0UL,_llvm::APFloat_*,_false> local_20;
  
  pAVar1 = (this->Floats)._M_t.
           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
           super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
  pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
  if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    pAVar2 = pAVar1;
  }
  if ((*(undefined1 *)((long)&pAVar2->U + 0x12) & 7) == 2) {
    DoubleAPFloat((DoubleAPFloat *)auStack_28,this);
    pAVar1 = (this->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar2 = (APFloat *)(pAVar1->U).IEEE.significand.part;
    if ((pAVar1->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar2 = pAVar1;
    }
    makeLargest((DoubleAPFloat *)auStack_28,
                (bool)((*(undefined1 *)((long)&pAVar2->U + 0x12) & 8) >> 3));
    cVar3 = compare((DoubleAPFloat *)auStack_28,this);
    bVar4 = cVar3 == cmpEqual;
    if ((_Head_base<0UL,_llvm::APFloat_*,_false>)local_20._M_head_impl !=
        (_Head_base<0UL,_llvm::APFloat_*,_false>)0x0) {
      std::default_delete<llvm::APFloat[]>::operator()
                ((default_delete<llvm::APFloat[]> *)&local_20,local_20._M_head_impl);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

static inline unsigned int
partCountForBits(unsigned int bits)
{
  return ((bits) + APFloatBase::integerPartWidth - 1) / APFloatBase::integerPartWidth;
}